

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O3

void __thiscall
Selector::addListener
          (Selector *this,int fd,short events,SelectorListener *listener,jh_ptr_int_t private_data)

{
  Node *pNVar1;
  Node *pNVar2;
  ListenerNode *pLVar3;
  Node *pNVar4;
  AutoLock l;
  AutoLock AStack_48;
  
  pLVar3 = (ListenerNode *)
           operator_new(0x18,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                        ,0x68);
  pLVar3->mFd = fd;
  pLVar3->mEvents = events;
  pLVar3->mListener = listener;
  pLVar3->mPrivateData = private_data;
  AutoLock::AutoLock(&AStack_48,&this->mLock);
  pNVar4 = (Node *)operator_new(0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                ,0xa7);
  pNVar4->val = pLVar3;
  pNVar1 = (this->mList).mTail;
  pNVar2 = pNVar1->prev;
  pNVar4->prev = pNVar2;
  pNVar4->next = pNVar1;
  pNVar2->next = pNVar4;
  pNVar1->prev = pNVar4;
  updateListeners(this);
  AutoLock::~AutoLock(&AStack_48);
  return;
}

Assistant:

void Selector::addListener( int fd, short events, SelectorListener *listener, jh_ptr_int_t private_data )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	ListenerNode *node = jh_new ListenerNode();
	
	node->mFd = fd;
	node->mEvents = events;
	node->mListener = listener;
	node->mPrivateData = private_data;
	
	AutoLock l( mLock );
	
	mList.push_back( node );	
	updateListeners();	
	
	LOG( "added fd %d events %x, list size %d", fd, events, mList.size() );
}